

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaDefragmentationContext_T::AllocInOtherBlock
          (VmaDefragmentationContext_T *this,size_t start,size_t end,MoveAllocationData *data,
          VmaBlockVector *vector)

{
  VmaDeviceMemoryBlock *pBlock;
  size_t sVar1;
  VmaDefragmentationMove *pVVar2;
  ulong uVar3;
  VmaAllocation pVVar4;
  undefined4 uVar5;
  int iVar6;
  VkResult VVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  
  if (start < end) {
    do {
      pBlock = (vector->m_Blocks).m_pArray[start];
      iVar6 = (*pBlock->m_pMetadata->_vptr_VmaBlockMetadata[6])();
      iVar10 = 0;
      if ((data->size <= CONCAT44(extraout_var,iVar6)) &&
         (VVar7 = VmaBlockVector::AllocateFromBlock
                            (vector,pBlock,data->size,data->alignment,data->flags,this,data->type,0,
                             &(data->move).dstTmpAllocation), VVar7 == VK_SUCCESS)) {
        sVar1 = (this->m_Moves).m_Count;
        VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::resize
                  (&this->m_Moves,sVar1 + 1);
        pVVar2 = (this->m_Moves).m_pArray;
        pVVar2[sVar1].dstTmpAllocation = (data->move).dstTmpAllocation;
        uVar5 = *(undefined4 *)&(data->move).field_0x4;
        pVVar4 = (data->move).srcAllocation;
        pVVar2 = pVVar2 + sVar1;
        pVVar2->operation = (data->move).operation;
        *(undefined4 *)&pVVar2->field_0x4 = uVar5;
        pVVar2->srcAllocation = pVVar4;
        uVar3 = this->m_MaxPassBytes;
        uVar8 = (this->m_PassStats).bytesMoved + data->size;
        (this->m_PassStats).bytesMoved = uVar8;
        uVar9 = (this->m_PassStats).allocationsMoved + 1;
        (this->m_PassStats).allocationsMoved = uVar9;
        iVar10 = 2 - (uint)(uVar3 <= uVar8 || this->m_MaxPassAllocations <= uVar9);
      }
      if (iVar10 != 0) {
        if (iVar10 != 1) {
          return false;
        }
        return true;
      }
      start = start + 1;
    } while (end != start);
  }
  return false;
}

Assistant:

bool VmaDefragmentationContext_T::AllocInOtherBlock(size_t start, size_t end, MoveAllocationData& data, VmaBlockVector& vector)
{
    for (; start < end; ++start)
    {
        VmaDeviceMemoryBlock* dstBlock = vector.GetBlock(start);
        if (dstBlock->m_pMetadata->GetSumFreeSize() >= data.size)
        {
            if (vector.AllocateFromBlock(dstBlock,
                data.size,
                data.alignment,
                data.flags,
                this,
                data.type,
                0,
                &data.move.dstTmpAllocation) == VK_SUCCESS)
            {
                m_Moves.push_back(data.move);
                if (IncrementCounters(data.size))
                    return true;
                break;
            }
        }
    }
    return false;
}